

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

DatabaseInterface * Fossilize::create_dumb_folder_database(char *directory_path,DatabaseMode mode)

{
  char *pcVar1;
  DumbDirectoryDatabase *this;
  allocator local_41;
  string local_40;
  DumbDirectoryDatabase *db;
  char *pcStack_10;
  DatabaseMode mode_local;
  char *directory_path_local;
  
  db._4_4_ = mode;
  pcStack_10 = directory_path;
  this = (DumbDirectoryDatabase *)operator_new(0x268);
  pcVar1 = pcStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
  DumbDirectoryDatabase::DumbDirectoryDatabase(this,&local_40,db._4_4_);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return &this->super_DatabaseInterface;
}

Assistant:

DatabaseInterface *create_dumb_folder_database(const char *directory_path, DatabaseMode mode)
{
	auto *db = new DumbDirectoryDatabase(directory_path, mode);
	return db;
}